

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O3

uint crnlib::dxt1_block::get_block_colors3(color_quad_u8 *pDst,uint16 color0,uint16 color1)

{
  uint uVar1;
  uint uVar2;
  undefined6 in_register_00000012;
  ulong uVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  ushort uVar8;
  
  uVar5 = CONCAT62(in_register_00000032,color0);
  uVar3 = CONCAT62(in_register_00000012,color1);
  uVar2 = (uint)uVar5;
  uVar1 = ((uVar2 & 0x1c) >> 2) + uVar2 * 8;
  uVar6 = (short)(uVar5 >> 0xb) << 3 | color0 >> 0xd;
  uVar2 = (uint)(uVar5 >> 9) & 3 | uVar2 >> 3 & 0xfc;
  uVar7 = (uint)uVar3;
  uVar4 = ((uVar7 & 0x1c) >> 2) + uVar7 * 8;
  uVar8 = (short)(uVar3 >> 0xb) << 3 | color1 >> 0xd;
  uVar7 = (uint)(uVar3 >> 9) & 3 | uVar7 >> 3 & 0xfc;
  (pDst->field_0).field_0.r = (uchar)uVar6;
  (pDst->field_0).field_0.g = (uchar)uVar2;
  (pDst->field_0).field_0.b = (uchar)uVar1;
  (pDst->field_0).field_0.a = 0xff;
  pDst[1].field_0.field_0.r = (uchar)uVar8;
  pDst[1].field_0.field_0.g = (uchar)uVar7;
  pDst[1].field_0.field_0.b = (uchar)uVar4;
  pDst[1].field_0.field_0.a = 0xff;
  pDst[2].field_0.field_0.r = (uchar)((uint)uVar8 + (uint)uVar6 >> 1);
  pDst[2].field_0.field_0.g = (uchar)(uVar7 + uVar2 >> 1);
  pDst[2].field_0.field_0.b = (uchar)((uVar4 & 0xff) + (uVar1 & 0xff) >> 1);
  pDst[2].field_0.field_0.a = 0xff;
  pDst[3].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  return 3;
}

Assistant:

color_quad_u8 dxt1_block::unpack_color(uint16 packed_color, bool scaled, uint alpha) {
  uint b = packed_color & 31U;
  uint g = (packed_color >> 5U) & 63U;
  uint r = (packed_color >> 11U) & 31U;

  if (scaled) {
    b = (b << 3U) | (b >> 2U);
    g = (g << 2U) | (g >> 4U);
    r = (r << 3U) | (r >> 2U);
  }

  return color_quad_u8(cNoClamp, r, g, b, math::minimum(alpha, 255U));
}